

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::IAsyncTask> *this,RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr)

{
  IAsyncTask *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  RefCountersImpl *pRVar3;
  
  if (AutoPtr->m_pObject == (IAsyncTask *)0x0) {
    this->m_pRefCounters = (RefCountersImpl *)0x0;
    this->m_pObject = (IAsyncTask *)0x0;
  }
  else {
    iVar2 = (*(AutoPtr->m_pObject->super_IObject)._vptr_IObject[3])();
    pRVar3 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                       ((IReferenceCounters *)CONCAT44(extraout_var,iVar2));
    pIVar1 = AutoPtr->m_pObject;
    this->m_pRefCounters = pRVar3;
    this->m_pObject = pIVar1;
    if (pRVar3 != (RefCountersImpl *)0x0) {
      LOCK();
      (pRVar3->m_NumWeakReferences).super___atomic_base<int>._M_i =
           (pRVar3->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(RefCntAutoPtr<T>& AutoPtr) noexcept :
        m_pRefCounters{AutoPtr ? ClassPtrCast<RefCountersImpl>(AutoPtr->GetReferenceCounters()) : nullptr},
        m_pObject{static_cast<T*>(AutoPtr)}
    {
        if (m_pRefCounters)
            m_pRefCounters->AddWeakRef();
    }